

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fctstr_startswith(char *str,char *check)

{
  uint uVar1;
  int iVar2;
  size_t __n;
  
  uVar1 = 1;
  if ((str != (char *)0x0 || check != (char *)0x0) &&
     (uVar1 = 0, (str == (char *)0x0) == (check == (char *)0x0))) {
    __n = strlen(check);
    iVar2 = strncmp(str,check,__n);
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

static int
fctstr_startswith(char const *str, char const *check)
{
    char const *sp;
    if ( str == NULL && check == NULL )
    {
        return 1;
    }
    else if ( ((str == NULL) && (check != NULL))
              || ((str != NULL) && (check == NULL)) )
    {
        return 0;
    }
    sp = strstr(str, check);
    return sp == str;
}